

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineDiscardRectangleStateCreateInfoEXT *create_info,
          ScratchAllocator *alloc,DynamicStateInfo *dynamic_state_info)

{
  VkPipelineDiscardRectangleStateCreateInfoEXT *pVVar1;
  VkRect2D *pVVar2;
  
  pVVar1 = copy<VkPipelineDiscardRectangleStateCreateInfoEXT>(this,create_info,1,alloc);
  if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
     (dynamic_state_info->discard_rectangle != true)) {
    pVVar2 = copy<VkRect2D>(this,pVVar1->pDiscardRectangles,(ulong)pVVar1->discardRectangleCount,
                            alloc);
    pVVar1->pDiscardRectangles = pVVar2;
  }
  else {
    pVVar1->pDiscardRectangles = (VkRect2D *)0x0;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineDiscardRectangleStateCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state_info)
{
	auto *discard_rectangles = copy(create_info, 1, alloc);
	if (dynamic_state_info && dynamic_state_info->discard_rectangle)
		discard_rectangles->pDiscardRectangles = nullptr;
	else
		discard_rectangles->pDiscardRectangles = copy(discard_rectangles->pDiscardRectangles, discard_rectangles->discardRectangleCount, alloc);
	return discard_rectangles;
}